

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape_string.cpp
# Opt level: O2

string * libtorrent::convert_to_native(string *__return_storage_ptr__,string *s)

{
  pair<int,_int> pVar1;
  bool bVar2;
  pair<int,_int> pVar3;
  size_t sVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar5;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  aux *this;
  size_t i;
  size_t sVar6;
  string_view str;
  mbstate_t local_58;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  char out [10];
  
  bVar2 = anon_unknown_5::need_conversion();
  if (bVar2) {
    local_58.__count = 0;
    local_58.__value = (_union_27)0x0;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_50._M_str = (s->_M_dataplus)._M_p;
    local_50._M_len = (size_t)s->_M_string_length;
    pVar1.first = 0x2e;
    pVar1.second = 0;
    pcVar5 = extraout_RDX;
    this = (aux *)s->_M_string_length;
    while (this != (aux *)0x0) {
      str._M_str = pcVar5;
      str._M_len = (size_t)local_50._M_str;
      pVar3 = aux::parse_utf8_codepoint(this,str);
      local_50 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (&local_50,(long)pVar3 >> 0x20,0xffffffffffffffff);
      if (pVar3.first == -1) {
        pVar3 = pVar1;
      }
      sVar4 = wcrtomb(out,pVar3.first,&local_58);
      if (sVar4 == 0xffffffffffffffff) {
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
        local_58.__count = 0;
        local_58.__value = (_union_27)0x0;
        pcVar5 = extraout_RDX_02;
      }
      else {
        pcVar5 = extraout_RDX_00;
        for (sVar6 = 0; sVar4 != sVar6; sVar6 = sVar6 + 1) {
          ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
          pcVar5 = extraout_RDX_01;
        }
      }
      this = (aux *)local_50._M_len;
    }
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convert_to_native(std::string const& s)
	{
		if (!need_conversion()) return s;

		std::mbstate_t state{};
		std::string ret;
		string_view ptr = s;
		while (!ptr.empty())
		{
			// decode a single utf-8 character
			auto [codepoint, len] = aux::parse_utf8_codepoint(ptr);

			if (codepoint == -1)
				codepoint = '.';

			ptr = ptr.substr(std::size_t(len));

			char out[10];
			std::size_t const size = std::wcrtomb(out, static_cast<wchar_t>(codepoint), &state);
			if (size == static_cast<std::size_t>(-1))
			{
				ret += '.';
				state = std::mbstate_t{};
			}
			else
				for (std::size_t i = 0; i < size; ++i)
					ret += out[i];
		}
		return ret;
	}